

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O2

void __thiscall
QOpenGLTextureHelper::qt_TextureParameteri
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLenum pname
          ,GLint param)

{
  long in_FS_OFFSET;
  undefined1 local_48 [12];
  GLint GStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1b4087::TextureBinder::TextureBinder
            ((TextureBinder *)local_48,this->functions,texture,target,bindingTarget);
  (**(code **)(*(long *)this->functions + 0x158))(target,pname,param);
  (*(code *)**(undefined8 **)local_48._0_8_)((ulong)stack0xffffffffffffffc0 & 0xffffffff,GStack_3c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureParameteri(GLuint texture, GLenum target, GLenum bindingTarget, GLenum pname, GLint param)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexParameteri(target, pname, param);
}